

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O0

SwitchStatement * __thiscall SQASTReader::readSwitchStatement(SQASTReader *this)

{
  SwitchStatement *this_00;
  uint64_t uVar1;
  SwitchStatement *pSVar2;
  Statement *pSVar3;
  SQASTReader *in_RDI;
  Statement *s;
  Expr *v;
  size_t i;
  size_t size;
  SwitchStatement *swtch;
  Expr *expr;
  undefined8 in_stack_ffffffffffffffb8;
  size_type_conflict newSize;
  Expr *in_stack_ffffffffffffffd0;
  Arena *in_stack_ffffffffffffffd8;
  ulong uVar4;
  SQASTReader *in_stack_ffffffffffffffe0;
  
  newSize = (size_type_conflict)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  readExpression(in_RDI);
  this_00 = newNode<SQCompilation::SwitchStatement,Arena*,SQCompilation::Expr*>
                      (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0
                      );
  uVar1 = InputStream::readUInt64((InputStream *)0x1428f5);
  SQCompilation::SwitchStatement::cases(this_00);
  ArenaVector<SQCompilation::SwitchCase>::resize
            ((ArenaVector<SQCompilation::SwitchCase> *)in_RDI,newSize);
  for (uVar4 = 0; uVar4 < uVar1; uVar4 = uVar4 + 1) {
    pSVar2 = (SwitchStatement *)readExpression(in_RDI);
    pSVar3 = readStatement(in_RDI);
    SQCompilation::SwitchStatement::addCases(pSVar2,(Expr *)pSVar3,(Statement *)in_RDI);
  }
  pSVar2 = this_00;
  pSVar3 = readNullableStatement(in_RDI);
  SQCompilation::SwitchStatement::addDefault(pSVar2,pSVar3);
  return this_00;
}

Assistant:

SwitchStatement *SQASTReader::readSwitchStatement() {
  Expr *expr = readExpression();

  SwitchStatement *swtch = newNode<SwitchStatement>(astArena, (Expr *)expr);

  size_t size = stream->readUInt64();

  swtch->cases().resize(size);

  for (size_t i = 0; i < size; ++i) {
    Expr *v = readExpression();
    Statement *s = readStatement();

    swtch->addCases(v, s);
  }

  swtch->addDefault(readNullableStatement());

  return swtch;
}